

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

size_t __thiscall AddrManImpl::Size(AddrManImpl *this,optional<Network> net,optional<bool> in_new)

{
  long lVar1;
  AddrManImpl *this_00;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RDI;
  long in_FS_OFFSET;
  size_t ret;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  Mutex *in_stack_ffffffffffffff88;
  AddrManImpl *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffc0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *this_01;
  _Optional_payload_base<bool> in_stack_ffffffffffffffe6;
  _Optional_payload_base<Network> in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  MaybeCheckNotHeld(in_stack_ffffffffffffff88);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (this_01,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (char *)in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  Check(in_stack_ffffffffffffffb0);
  this_00 = (AddrManImpl *)
            Size_(in_stack_ffffffffffffffb0,(optional<Network>)in_stack_ffffffffffffffe8,
                  (optional<bool>)in_stack_ffffffffffffffe6);
  Check(this_00);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (size_t)this_00;
  }
  __stack_chk_fail();
}

Assistant:

size_t AddrManImpl::Size(std::optional<Network> net, std::optional<bool> in_new) const
{
    LOCK(cs);
    Check();
    auto ret = Size_(net, in_new);
    Check();
    return ret;
}